

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre_test.cc
# Opt level: O2

void __thiscall TrivialRETest_Runnings_Test::TestBody(TrivialRETest_Runnings_Test *this)

{
  uint *puVar1;
  pointer pbVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  Message *pMVar5;
  long lVar6;
  allocator_type *__a;
  undefined8 *puVar7;
  size_t *psVar8;
  string *psVar9;
  iterator pbVar10;
  basic_string_view<char,_std::char_traits<char>_> *pbVar11;
  char *in_R9;
  undefined1 auVar12 [8];
  allocator_type *paVar13;
  byte bVar14;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_07;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_08;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_09;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_14;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_16;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_17;
  initializer_list<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  __l_18;
  string_view str;
  string_view str_00;
  string_view str_01;
  basic_string_view<char,_std::char_traits<char>_> bVar15;
  basic_string_view<char,_std::char_traits<char>_> local_798 [6];
  basic_string_view<char,_std::char_traits<char>_> local_738 [5];
  basic_string_view<char,_std::char_traits<char>_> local_6e8 [5];
  basic_string_view<char,_std::char_traits<char>_> local_698 [5];
  basic_string_view<char,_std::char_traits<char>_> local_648;
  undefined8 local_638;
  char *pcStack_630;
  undefined8 local_628;
  char *pcStack_620;
  undefined8 local_618;
  char *pcStack_610;
  basic_string_view<char,_std::char_traits<char>_> local_608;
  undefined8 local_5f8;
  char *pcStack_5f0;
  undefined8 local_5e8;
  char *pcStack_5e0;
  undefined8 local_5d8;
  char *pcStack_5d0;
  basic_string_view<char,_std::char_traits<char>_> local_5c8;
  undefined8 local_5b8;
  char *pcStack_5b0;
  undefined8 local_5a8;
  char *pcStack_5a0;
  undefined8 local_598;
  char *pcStack_590;
  basic_string_view<char,_std::char_traits<char>_> local_588;
  undefined8 local_578;
  char *pcStack_570;
  undefined8 local_568;
  char *pcStack_560;
  undefined8 local_558;
  char *pcStack_550;
  basic_string_view<char,_std::char_traits<char>_> local_548;
  undefined8 local_538;
  char *pcStack_530;
  undefined8 local_528;
  char *pcStack_520;
  undefined8 local_518;
  char *pcStack_510;
  basic_string_view<char,_std::char_traits<char>_> local_508;
  undefined8 local_4f8;
  char *pcStack_4f0;
  undefined8 local_4e8;
  char *pcStack_4e0;
  undefined8 local_4d8;
  char *pcStack_4d0;
  basic_string_view<char,_std::char_traits<char>_> local_4c8;
  undefined8 local_4b8;
  char *pcStack_4b0;
  undefined8 local_4a8;
  char *pcStack_4a0;
  basic_string_view<char,_std::char_traits<char>_> local_498;
  undefined8 local_488;
  char *pcStack_480;
  undefined8 local_478;
  char *pcStack_470;
  basic_string_view<char,_std::char_traits<char>_> local_468;
  undefined8 local_458;
  char *pcStack_450;
  undefined8 local_448;
  char *pcStack_440;
  basic_string_view<char,_std::char_traits<char>_> local_438;
  undefined8 local_428;
  char *pcStack_420;
  undefined1 local_410 [8];
  Matcher m;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_3e0;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_3c8;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_3b0;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_398;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_380;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_368;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_350;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_338;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_320;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_308;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_2f0;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_2d8;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_2c0;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_2a8;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_290;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_278;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_260;
  basic_string_view<char,_std::char_traits<char>_> local_248 [6];
  basic_string_view<char,_std::char_traits<char>_> local_1e8 [6];
  undefined1 auStack_188 [8];
  string_view s;
  string local_128 [3];
  undefined1 auStack_c8 [8];
  AssertionResult gtest_ar_;
  undefined1 local_68 [8];
  vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  cases2;
  allocator_type local_44;
  allocator_type local_43;
  allocator_type local_42;
  allocator_type local_41;
  allocator_type local_40;
  allocator_type local_3f;
  allocator_type local_3e;
  allocator_type local_3d;
  allocator_type local_3c;
  allocator_type local_3b;
  allocator_type local_3a;
  allocator_type local_39;
  allocator_type local_38;
  allocator_type local_37;
  allocator_type local_36;
  allocator_type local_35;
  allocator_type local_34;
  allocator_type local_33;
  allocator_type local_32;
  allocator_type local_31;
  
  bVar14 = 0;
  local_618 = 4;
  pcStack_610 = "+not";
  local_628 = 1;
  pcStack_620 = "+";
  local_638 = 2;
  pcStack_630 = "+a";
  local_648._M_len = 2;
  local_648._M_str = "a*";
  __l._M_len = 4;
  __l._M_array = &local_648;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)local_410,__l,&local_44);
  psVar8 = &DAT_0014e590;
  pbVar11 = local_738;
  for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
    pbVar11->_M_len = *psVar8;
    psVar8 = psVar8 + (ulong)bVar14 * -2 + 1;
    pbVar11 = (basic_string_view<char,_std::char_traits<char>_> *)&pbVar11[-(ulong)bVar14]._M_str;
  }
  __l_00._M_len = 5;
  __l_00._M_array = local_738;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)&m.super__Function_base._M_manager,__l_00,&local_43);
  puVar7 = &DAT_0014e5e0;
  psVar9 = local_128;
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    (psVar9->_M_dataplus)._M_p = (pointer)*puVar7;
    puVar7 = puVar7 + (ulong)bVar14 * -2 + 1;
    psVar9 = (string *)((long)psVar9 + (ulong)bVar14 * -0x10 + 8);
  }
  __l_01._M_len = 6;
  __l_01._M_array = (iterator)local_128;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_3e0,__l_01,&local_42);
  local_5d8 = 1;
  pcStack_5d0 = "-";
  local_5e8 = 2;
  pcStack_5e0 = "+a";
  local_5f8 = 2;
  pcStack_5f0 = "-\n";
  local_608._M_len = 1;
  local_608._M_str = ".";
  __l_02._M_len = 4;
  __l_02._M_array = &local_608;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_3c8,__l_02,&local_41);
  psVar8 = &DAT_0014e680;
  pbVar10 = (iterator)auStack_188;
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    pbVar10->_M_len = *psVar8;
    psVar8 = psVar8 + (ulong)bVar14 * -2 + 1;
    pbVar10 = (iterator)&pbVar10[-(ulong)bVar14]._M_str;
  }
  __l_03._M_len = 6;
  __l_03._M_array = (iterator)auStack_188;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_3b0,__l_03,&local_40);
  psVar8 = &DAT_0014e6e0;
  pbVar10 = (iterator)auStack_c8;
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    pbVar10->_M_len = *psVar8;
    psVar8 = psVar8 + (ulong)bVar14 * -2 + 1;
    pbVar10 = (iterator)&pbVar10[-(ulong)bVar14]._M_str;
  }
  __l_04._M_len = 6;
  __l_04._M_array = (iterator)auStack_c8;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_398,__l_04,&local_3f);
  local_598 = 2;
  pcStack_590 = "+z";
  local_5a8 = 2;
  pcStack_5a0 = "-b";
  local_5b8 = 2;
  pcStack_5b0 = "+a";
  local_5c8._M_len = 4;
  local_5c8._M_str = "[az]";
  __l_05._M_len = 4;
  __l_05._M_array = &local_5c8;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_380,__l_05,&local_3e);
  psVar8 = &DAT_0014e780;
  pbVar11 = local_6e8;
  for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
    pbVar11->_M_len = *psVar8;
    psVar8 = psVar8 + (ulong)bVar14 * -2 + 1;
    pbVar11 = (basic_string_view<char,_std::char_traits<char>_> *)&pbVar11[-(ulong)bVar14]._M_str;
  }
  __l_06._M_len = 5;
  __l_06._M_array = local_6e8;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_368,__l_06,&local_3d);
  psVar8 = &DAT_0014e7d0;
  pbVar11 = local_1e8;
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    pbVar11->_M_len = *psVar8;
    psVar8 = psVar8 + (ulong)bVar14 * -2 + 1;
    pbVar11 = (basic_string_view<char,_std::char_traits<char>_> *)&pbVar11[-(ulong)bVar14]._M_str;
  }
  __l_07._M_len = 6;
  __l_07._M_array = local_1e8;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_350,__l_07,&local_3c);
  psVar8 = &DAT_0014e830;
  pbVar11 = local_698;
  for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
    pbVar11->_M_len = *psVar8;
    psVar8 = psVar8 + (ulong)bVar14 * -2 + 1;
    pbVar11 = (basic_string_view<char,_std::char_traits<char>_> *)&pbVar11[-(ulong)bVar14]._M_str;
  }
  __l_08._M_len = 5;
  __l_08._M_array = local_698;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_338,__l_08,&local_3b);
  local_4a8 = 2;
  pcStack_4a0 = "+\n";
  local_4b8 = 2;
  pcStack_4b0 = "+a";
  local_4c8._M_len = 3;
  local_4c8._M_str = "[^]";
  __l_09._M_len = 3;
  __l_09._M_array = &local_4c8;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_320,__l_09,&local_3a);
  local_478 = 7;
  pcStack_470 = "+asdasd";
  local_488 = 1;
  pcStack_480 = "+";
  local_498._M_len = 0;
  local_498._M_str = "";
  __l_10._M_len = 3;
  __l_10._M_array = &local_498;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_308,__l_10,&local_39);
  psVar8 = &DAT_0014e8e0;
  pbVar11 = local_248;
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    pbVar11->_M_len = *psVar8;
    psVar8 = psVar8 + (ulong)bVar14 * -2 + 1;
    pbVar11 = (basic_string_view<char,_std::char_traits<char>_> *)&pbVar11[-(ulong)bVar14]._M_str;
  }
  __l_11._M_len = 6;
  __l_11._M_array = local_248;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_2f0,__l_11,&local_38);
  psVar8 = &DAT_0014e940;
  pbVar11 = local_798;
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    pbVar11->_M_len = *psVar8;
    psVar8 = psVar8 + (ulong)bVar14 * -2 + 1;
    pbVar11 = (basic_string_view<char,_std::char_traits<char>_> *)&pbVar11[-(ulong)bVar14]._M_str;
  }
  __l_12._M_len = 6;
  __l_12._M_array = local_798;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_2d8,__l_12,&local_37);
  local_558 = 4;
  pcStack_550 = "+b\na";
  local_568 = 3;
  pcStack_560 = "-ba";
  local_578 = 2;
  pcStack_570 = "+a";
  local_588._M_len = 2;
  local_588._M_str = "^a";
  __l_13._M_len = 4;
  __l_13._M_array = &local_588;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_2c0,__l_13,&local_36);
  local_518 = 4;
  pcStack_510 = "+b\na";
  local_528 = 3;
  pcStack_520 = "+ba";
  local_538 = 4;
  pcStack_530 = "+a\nb";
  local_548._M_len = 2;
  local_548._M_str = "a$";
  __l_14._M_len = 4;
  __l_14._M_array = &local_548;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_2a8,__l_14,&local_35);
  local_428 = 4;
  pcStack_420 = "+a\nb";
  local_438._M_len = 5;
  local_438._M_str = "a$\\nb";
  __l_15._M_len = 2;
  __l_15._M_array = &local_438;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_290,__l_15,&local_34);
  local_448 = 4;
  pcStack_440 = "+aaa";
  local_458 = 1;
  pcStack_450 = "+";
  local_468._M_len = 1;
  local_468._M_str = "$";
  __l_16._M_len = 3;
  __l_16._M_array = &local_468;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_278,__l_16,&local_33);
  local_4d8 = 5;
  pcStack_4d0 = "+aaa\n";
  local_4e8 = 4;
  pcStack_4e0 = "-aaa";
  local_4f8 = 1;
  pcStack_4f0 = "+";
  local_508._M_len = 2;
  local_508._M_str = "^$";
  __l_17._M_len = 4;
  __l_17._M_array = &local_508;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_260,__l_17,&local_32);
  __a = &local_31;
  __l_18._M_len = 0x13;
  __l_18._M_array = (iterator)local_410;
  std::
  vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  ::vector((vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
            *)local_68,__l_18,__a);
  lVar6 = 0x1b0;
  do {
    std::
    _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~_Vector_base((_Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)(local_410 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  cases2.
  super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       cases2.
       super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auVar12 = local_68;
  do {
    if (auVar12 ==
        (undefined1  [8])
        cases2.
        super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
      ::~vector((vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                 *)local_68);
      return;
    }
    pbVar2 = (((pointer)auVar12)->
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    str._M_str = (char *)__a;
    str._M_len = (size_t)pbVar2->_M_str;
    trivialre::CompileREOrDie((Matcher *)local_410,(trivialre *)pbVar2->_M_len,str);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)local_128,
               (((pointer)auVar12)->
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,(allocator<char> *)local_1e8);
    _Var3._M_p = local_128[0]._M_dataplus._M_p;
    auStack_c8 = (undefined1  [8])0x0;
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )local_248;
    trivialre::re_compiler::C<StringTestingBuilder,trivialre::re_compiler::ErrorPolicy>::
    CompileOrDie_abi_cxx11_
              ((Matcher *)auStack_188,
               (C<StringTestingBuilder,trivialre::re_compiler::ErrorPolicy> *)auStack_c8,
               *(((pointer)auVar12)->
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start);
    printf("testing /%s/ re: %s\n",_Var3._M_p,CONCAT44(auStack_188._4_4_,auStack_188._0_4_));
    std::__cxx11::string::~string((string *)auStack_188);
    std::__cxx11::string::~string((string *)local_128);
    lVar6 = 0x10;
    paVar13 = (allocator_type *)0x1;
    while( true ) {
      pbVar2 = (((pointer)auVar12)->
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      __a = (allocator_type *)
            ((long)(((pointer)auVar12)->
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 4);
      if (__a <= paVar13) break;
      puVar1 = (uint *)((long)&pbVar2->_M_len + lVar6);
      auStack_188._0_4_ = *puVar1;
      auStack_188._4_4_ = puVar1[1];
      s._M_len._0_4_ = puVar1[2];
      s._M_len._4_4_ = puVar1[3];
      printf("trying: %.*s\n",(ulong)(uint)auStack_188._0_4_,*(undefined8 *)(puVar1 + 2));
      if (*(char *)CONCAT44(s._M_len._4_4_,(uint)s._M_len) == '+') {
        bVar15 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_188,1,
                            0xffffffffffffffff);
        str_00._M_len = bVar15._M_str;
        str_00._M_str = (char *)__a;
        bVar4 = trivialre::MatchSubstring((trivialre *)local_410,(Matcher *)bVar15._M_len,str_00);
        auStack_c8[0] = bVar4;
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
        if (!bVar4) {
          testing::Message::Message((Message *)local_1e8);
          std::operator<<((ostream *)(local_1e8[0]._M_len + 0x10),"re: ");
          pMVar5 = testing::Message::operator<<
                             ((Message *)local_1e8,
                              (((pointer)auVar12)->
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start);
          pMVar5 = testing::Message::operator<<(pMVar5,(char (*) [5])" s: ");
          pMVar5 = testing::Message::operator<<
                             (pMVar5,(basic_string_view<char,_std::char_traits<char>_> *)auStack_188
                             );
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (local_128,(internal *)auStack_c8,
                     (AssertionResult *)"MatchSubstring(m, s.substr(1))","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_248,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre_test.cc"
                     ,0xaa,local_128[0]._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_248,pMVar5);
LAB_0010a8c1:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_248);
          std::__cxx11::string::~string((string *)local_128);
          if ((long *)local_1e8[0]._M_len != (long *)0x0) {
            (**(code **)(*(long *)local_1e8[0]._M_len + 8))();
          }
        }
      }
      else {
        bVar15 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_188,1,
                            0xffffffffffffffff);
        str_01._M_len = bVar15._M_str;
        str_01._M_str = (char *)__a;
        bVar4 = trivialre::MatchSubstring((trivialre *)local_410,(Matcher *)bVar15._M_len,str_01);
        auStack_c8[0] = !bVar4;
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
        if (bVar4) {
          testing::Message::Message((Message *)local_1e8);
          std::operator<<((ostream *)(local_1e8[0]._M_len + 0x10),"re: ");
          pMVar5 = testing::Message::operator<<
                             ((Message *)local_1e8,
                              (((pointer)auVar12)->
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start);
          pMVar5 = testing::Message::operator<<(pMVar5,(char (*) [5])" s: ");
          pMVar5 = testing::Message::operator<<
                             (pMVar5,(basic_string_view<char,_std::char_traits<char>_> *)auStack_188
                             );
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (local_128,(internal *)auStack_c8,
                     (AssertionResult *)"MatchSubstring(m, s.substr(1))","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_248,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre_test.cc"
                     ,0xad,local_128[0]._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_248,pMVar5);
          goto LAB_0010a8c1;
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar_);
      paVar13 = paVar13 + 1;
      lVar6 = lVar6 + 0x10;
    }
    std::_Function_base::~_Function_base((_Function_base *)local_410);
    auVar12 = (undefined1  [8])((long)auVar12 + 0x18);
  } while( true );
}

Assistant:

TEST(TrivialRETest, Runnings) {
  // Format is {re, example...}. Each example is prefixed with '+' for
  // must match or '-' for must not.
  std::vector<std::vector<std::string_view>> cases2 = {
      {"a*", "+a", "+", "+not"},
      {"aa*", "+a", "+aaa", "+ba", "-b"},
      {"a+", "+a", "+aa", "+aaa", "-", "-b"},
      {".", "-\n", "+a", "-"},

      {"[a-f]", "+a", "-z", "-", "+f", "--"},
      {"[a-f-]", "+a", "-z", "-", "+f", "+-"},
      {"[az]", "+a", "-b", "+z"},
      {"[^a-f]", "-a", "+z", "-", "-f"},
      {"[^a-f-]", "-a", "+z", "-", "-f", "--"},
      {"[a-f0-9]", "+a", "-z", "+0", "+9"},
      {"[^]", "+a", "+\n"},
      {"", "+", "+asdasd"},

      {"a(b|c+)d", "+abd", "-ab", "-abcd", "+accd", "-ad"},
      {"a(b|c+)?d", "+abd", "-ab", "-abcd", "+accd", "+ad"},

      {"^a", "+a", "-ba", "+b\na"},
      {"a$", "+a\nb", "+ba", "+b\na"},
      {"a$\\nb", "+a\nb"},
      {"$", "+", "+aaa"},
      {"^$", "+", "-aaa", "+aaa\n"},
  };

  for (const auto& vec : cases2) {
    Matcher m = CompileREOrDie(vec[0]);
    printf("testing /%s/ re: %s\n", std::string(vec[0]).c_str(),
           trivialre::re_compiler::C<StringTestingBuilder>({}).CompileOrDie(vec[0])
               .c_str());
    for (size_t i = 1; i < vec.size(); i++) {
      std::string_view s = vec[i];
      printf("trying: %.*s\n", int(s.size()), s.data());
      if (s[0] == '+') {
        EXPECT_TRUE(MatchSubstring(m, s.substr(1))) << "re: " << vec[0] << " s: " << s;
      } else {
        assert(s[0] == '-');
        EXPECT_FALSE(MatchSubstring(m, s.substr(1))) << "re: " << vec[0] << " s: " << s;
      }
    }
  }
}